

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O0

void absl::lts_20240722::container_internal::
     Deallocate<8ul,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::util::SimpleFieldComparator::Tolerance>>>
               (allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::util::SimpleFieldComparator::Tolerance>_>
                *alloc,void *p,size_t n)

{
  allocator<absl::lts_20240722::container_internal::AlignedType<8ul>> local_21;
  size_t sStack_20;
  A my_mem_alloc;
  size_t n_local;
  void *p_local;
  allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::util::SimpleFieldComparator::Tolerance>_>
  *alloc_local;
  
  sStack_20 = n;
  if (n == 0) {
    __assert_fail("n && \"n must be positive\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/container_memory.h"
                  ,0x58,
                  "void absl::container_internal::Deallocate(Alloc *, void *, size_t) [Alignment = 8UL, Alloc = std::allocator<std::pair<const google::protobuf::FieldDescriptor *const, google::protobuf::util::SimpleFieldComparator::Tolerance>>]"
                 );
  }
  std::allocator<absl::lts_20240722::container_internal::AlignedType<8ul>>::
  allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::util::SimpleFieldComparator::Tolerance>>
            (&local_21,alloc);
  std::allocator_traits<std::allocator<absl::lts_20240722::container_internal::AlignedType<8UL>_>_>
  ::deallocate((allocator_type *)&local_21,(pointer)p,sStack_20 + 7 >> 3);
  std::allocator<absl::lts_20240722::container_internal::AlignedType<8UL>_>::~allocator
            ((allocator<absl::lts_20240722::container_internal::AlignedType<8UL>_> *)&local_21);
  return;
}

Assistant:

void Deallocate(Alloc* alloc, void* p, size_t n) {
  static_assert(Alignment > 0, "");
  assert(n && "n must be positive");
  using M = AlignedType<Alignment>;
  using A = typename absl::allocator_traits<Alloc>::template rebind_alloc<M>;
  using AT = typename absl::allocator_traits<Alloc>::template rebind_traits<M>;
  // On macOS, "mem_alloc" is a #define with one argument defined in
  // rpc/types.h, so we can't name the variable "mem_alloc" and initialize it
  // with the "foo(bar)" syntax.
  A my_mem_alloc(*alloc);
  AT::deallocate(my_mem_alloc, static_cast<M*>(p),
                 (n + sizeof(M) - 1) / sizeof(M));
}